

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

bool __thiscall llvm::yaml::Output::matchEnumScalar(Output *this,char *Str,bool Match)

{
  size_t sVar1;
  undefined7 in_register_00000011;
  StringRef s;
  
  if (((int)CONCAT71(in_register_00000011,Match) != 0) && (this->EnumerationMatchFound == false)) {
    newLineCheck(this);
    if (Str == (char *)0x0) {
      sVar1 = 0;
    }
    else {
      sVar1 = strlen(Str);
    }
    s.Length = sVar1;
    s.Data = Str;
    outputUpToEndOfLine(this,s);
    this->EnumerationMatchFound = true;
  }
  return false;
}

Assistant:

bool Output::matchEnumScalar(const char *Str, bool Match) {
  if (Match && !EnumerationMatchFound) {
    newLineCheck();
    outputUpToEndOfLine(Str);
    EnumerationMatchFound = true;
  }
  return false;
}